

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O1

double gmath::transformGaussJordan(Matrixd *a)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  double *pdVar17;
  double *pdVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  uVar2 = a->nrows;
  uVar4 = (ulong)(int)uVar2;
  if ((long)uVar4 < 1) {
    dVar19 = 0.0;
  }
  else {
    uVar3 = a->ncols;
    pdVar5 = a->v;
    uVar11 = 0;
    dVar21 = 0.0;
    do {
      dVar19 = 0.0;
      if (0 < (int)uVar3) {
        uVar12 = 0;
        do {
          dVar19 = dVar19 + ABS(pdVar5[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
      if (dVar19 <= dVar21) {
        dVar19 = dVar21;
      }
      uVar11 = uVar11 + 1;
      pdVar5 = pdVar5 + uVar3;
      dVar21 = dVar19;
    } while (uVar11 != uVar4);
  }
  uVar3 = a->ncols;
  uVar11 = (ulong)uVar3;
  uVar16 = uVar3;
  if ((int)uVar3 < (int)uVar2) {
    uVar16 = uVar2;
  }
  dVar19 = (double)(int)uVar16 * dVar19 * 2.220446049250313e-16;
  uVar16 = uVar2;
  if ((int)uVar3 < (int)uVar2) {
    uVar16 = uVar3;
  }
  pdVar5 = a->v;
  lVar10 = (long)(int)uVar3;
  uVar12 = (ulong)uVar16;
  if ((int)uVar16 < 1) {
    uVar12 = 0;
  }
  uVar16 = 1;
  pdVar6 = pdVar5;
  uVar15 = 0;
  pdVar18 = pdVar5;
  dVar21 = 1.0;
  do {
    if (uVar15 == uVar12) {
      return dVar21;
    }
    uVar8 = (uint)uVar15;
    if ((long)(uVar15 + 1) < (long)uVar4) {
      pdVar17 = (double *)((long)(int)uVar16 * lVar10 * 8 + (long)pdVar18);
      uVar14 = uVar15 & 0xffffffff;
      uVar7 = uVar16;
      do {
        uVar9 = (ulong)uVar7;
        if (ABS(*pdVar17) <= ABS(pdVar5[uVar15 + (long)(int)(uVar3 * (int)uVar14)])) {
          uVar9 = uVar14;
        }
        uVar7 = uVar7 + 1;
        pdVar17 = pdVar17 + lVar10;
        uVar8 = (uint)uVar9;
        uVar14 = uVar9;
      } while (uVar2 != uVar7);
    }
    lVar13 = (long)(int)(uVar3 * uVar8);
    dVar1 = pdVar5[uVar15 + lVar13];
    dVar20 = 0.0;
    if (dVar19 <= ABS(dVar1)) {
      if (uVar15 != uVar8) {
        if ((long)uVar15 < lVar10) {
          uVar14 = 0;
          do {
            dVar20 = pdVar6[uVar14];
            pdVar6[uVar14] = pdVar18[lVar13 + uVar14];
            pdVar18[lVar13 + uVar14] = dVar20;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        dVar21 = -dVar21;
      }
      dVar20 = pdVar5[uVar15 + (long)(int)(uVar3 * (uint)uVar15)];
      if ((long)uVar15 < lVar10) {
        uVar14 = 0;
        do {
          pdVar6[uVar14] = pdVar6[uVar14] / dVar20;
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
      dVar20 = dVar21 * dVar20;
      if (0 < (int)uVar2) {
        uVar14 = 0;
        pdVar17 = pdVar18;
        do {
          if ((uVar14 != uVar15) && ((long)uVar15 < lVar10)) {
            dVar21 = pdVar5[uVar15 + uVar14 * lVar10];
            uVar9 = 0;
            do {
              pdVar17[uVar9] = pdVar6[uVar9] * -dVar21 + pdVar17[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar11 != uVar9);
          }
          uVar14 = uVar14 + 1;
          pdVar17 = pdVar17 + lVar10;
        } while (uVar14 != uVar4);
      }
    }
    uVar16 = uVar16 + 1;
    pdVar18 = pdVar18 + 1;
    pdVar6 = pdVar6 + lVar10 + 1;
    uVar11 = uVar11 - 1;
    uVar15 = uVar15 + 1;
    dVar21 = dVar20;
  } while (dVar19 <= ABS(dVar1));
  return dVar20;
}

Assistant:

double transformGaussJordan(Matrixd &a)
{
  double ret=1;

  // compute a meaningful epsilon

  double eps=0;

  for (int k=0; k<a.rows(); k++)
  {
    double v=0;

    for (int i=0; i<a.cols(); i++)
    {
      v+=std::abs(a(k, i));
    }

    eps=std::max(eps, v);
  }

  int n=std::max(a.rows(), a.cols());

  eps*=n;
  eps*=pow(2, -52);

  // for all rows

  n=std::min(a.rows(), a.cols());

  for (int j=0; j<n; j++)
  {
    // find pivot element

    int pivot=j;

    for (int k=j+1; k<a.rows(); k++)
    {
      if (std::abs(a(k, j)) > std::abs(a(pivot, j)))
      {
        pivot=k;
      }
    }

    // stop, if pivot element is 0

    if (std::abs(a(pivot, j)) < eps)
    {
      ret=0;
      break;
    }

    // interchange line j with line with pivot element

    if (pivot != j)
    {
      for (int i=j; i<a.cols(); i++)
      {
        double v=a(j, i);
        a(j, i)=a(pivot, i);
        a(pivot, i)=v;
      }

      ret*=-1;
    }

    pivot=j;

    // scale pivot line such that the pivot element becomes 1

    double s=a(pivot, pivot);

    for (int i=pivot; i<a.cols(); i++)
    {
      a(pivot, i)/=s;
    }

    ret*=s;

    // eliminate all elements of the pivot column except the pivot
    // element

    for (int k=0; k<a.rows(); k++)
    {
      if (k != pivot)
      {
        double v=a(k, pivot);

        for (int i=pivot; i<a.cols(); i++)
        {
          a(k, i)-=v*a(pivot, i);
        }
      }
    }
  }

  return ret;
}